

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

uint32_t mjs::anon_unknown_63::check_array_length(global_object *g,double n)

{
  version vVar1;
  native_error_exception *this;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_70 [2];
  wstring local_50;
  wstring_view local_30;
  uint local_1c;
  double dStack_18;
  uint32_t l;
  double n_local;
  global_object *g_local;
  
  dStack_18 = n;
  n_local = (double)g;
  local_1c = to_uint32((mjs *)g,n);
  vVar1 = global_object::language_version((global_object *)n_local);
  if ((0 < (int)vVar1) &&
     ((dStack_18 != (double)local_1c || (NAN(dStack_18) || NAN((double)local_1c))))) {
    this = (native_error_exception *)__cxa_allocate_exception(0x58);
    global_object::stack_trace_abi_cxx11_(&local_50,(global_object *)n_local);
    local_30 = (wstring_view)
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_50);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (local_70,L"Invalid array length");
    native_error_exception::native_error_exception(this,range,&local_30,local_70);
    __cxa_throw(this,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  return local_1c;
}

Assistant:

uint32_t check_array_length(const global_object& g, const double n) {
    const auto l = to_uint32(n);
    if (g.language_version() >= version::es3 && n != l) {
        throw native_error_exception(native_error_type::range, g.stack_trace(), L"Invalid array length");
    }
    return l;
}